

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mls8_i32(TCGContext_conflict1 *tcg_ctx,TCGv_i32 d,TCGv_i32 a,TCGv_i32 b)

{
  uintptr_t o;
  TCGTemp *local_28;
  TCGv_i32 local_20;
  
  gen_helper_neon_mul_u8(tcg_ctx,a,a,b);
  local_28 = (TCGTemp *)(d + (long)tcg_ctx);
  local_20 = a + (long)tcg_ctx;
  tcg_gen_callN_aarch64(tcg_ctx,helper_neon_sub_u8_aarch64,local_28,2,&local_28);
  return;
}

Assistant:

static void gen_mls8_i32(TCGContext *tcg_ctx, TCGv_i32 d, TCGv_i32 a, TCGv_i32 b)
{
    gen_helper_neon_mul_u8(tcg_ctx, a, a, b);
    gen_helper_neon_sub_u8(tcg_ctx, d, d, a);
}